

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall pegmatite::Context::do_parse_procs(Context *this,void *d)

{
  bool bVar1;
  parse_proc local_68;
  function<bool_(const_pegmatite::InputRange_&,_void_*)> *local_48;
  parse_proc *p;
  ParseMatch *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
  *__range2;
  void *d_local;
  Context *this_local;
  
  __end2 = std::
           vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
           ::begin(&this->matches);
  m = (ParseMatch *)
      std::
      vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ::end(&this->matches);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
                                     *)&m), bVar1) {
    p = (parse_proc *)
        __gnu_cxx::
        __normal_iterator<const_(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
        ::operator*(&__end2);
    get_parse_proc(&local_68,this,((reference)p)->matched_rule);
    local_48 = &local_68;
    bVar1 = std::function::operator_cast_to_bool((function *)local_48);
    if (!bVar1) {
      __assert_fail("p",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/plietar[P]Pegmatite/parser.cc"
                    ,0x12f,"bool pegmatite::Context::do_parse_procs(void *) const");
    }
    bVar1 = std::function<bool_(const_pegmatite::InputRange_&,_void_*)>::operator()
                      (local_48,(InputRange *)((long)&(p->super__Function_base)._M_functor + 8),d);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    std::function<bool_(const_pegmatite::InputRange_&,_void_*)>::~function(&local_68);
    if (!bVar1) goto LAB_001b7f32;
    __gnu_cxx::
    __normal_iterator<const_(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
    ::operator++(&__end2);
  }
  this_local._7_1_ = 1;
LAB_001b7f32:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool do_parse_procs(void *d) const
	{
		for(const auto &m : matches)
		{
			const parse_proc &p = get_parse_proc(*(m.matched_rule));
			assert(p);
			if (!p(m.source, d))
				return false;
		}

		return true;
	}